

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::java::WriteFieldDocComment(Printer *printer,FieldDescriptor *field)

{
  string local_78;
  string local_58;
  string local_38;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  Printer *printer_local;
  
  local_18 = field;
  field_local = (FieldDescriptor *)printer;
  FieldDescriptor::DebugString_abi_cxx11_(&local_78,field);
  FirstLineOf(&local_58,&local_78);
  EscapeJavadoc(&local_38,&local_58);
  io::Printer::Print(printer,"/**\n * <code>$def$</code>\n","def",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  WriteDocCommentBody<google::protobuf::FieldDescriptor>((Printer *)field_local,local_18);
  io::Printer::Print((Printer *)field_local," */\n");
  return;
}

Assistant:

void WriteFieldDocComment(io::Printer* printer, const FieldDescriptor* field) {
  // In theory we should have slightly different comments for setters, getters,
  // etc., but in practice everyone already knows the difference between these
  // so it's redundant information.

  // We use the field declaration as the first line of the comment, e.g.:
  //   optional string foo = 5;
  // This communicates a lot of information about the field in a small space.
  // If the field is a group, the debug string might end with {.
  printer->Print(
    "/**\n"
    " * <code>$def$</code>\n",
    "def", EscapeJavadoc(FirstLineOf(field->DebugString())));
  WriteDocCommentBody(printer, field);
  printer->Print(" */\n");
}